

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O3

int IDAGetSensConsistentIC(void *ida_mem,N_Vector *yyS0,N_Vector *ypS0)

{
  int line;
  int error_code;
  char *msgfmt;
  long lVar1;
  int iVar2;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar2 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x774;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar2 = -0x28;
    error_code = -0x28;
    line = 0x77c;
  }
  else {
    if (*(int *)((long)ida_mem + 0x4bc) == 0) {
      if ((yyS0 != (N_Vector *)0x0) && (0 < *(int *)((long)ida_mem + 0xa0))) {
        lVar1 = 0;
        do {
          N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)((long)ida_mem + 0x350) + lVar1 * 8),
                   yyS0[lVar1]);
          lVar1 = lVar1 + 1;
        } while (lVar1 < *(int *)((long)ida_mem + 0xa0));
      }
      if (ypS0 == (N_Vector *)0x0) {
        return 0;
      }
      if (*(int *)((long)ida_mem + 0xa0) < 1) {
        return 0;
      }
      lVar1 = 0;
      do {
        N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)((long)ida_mem + 0x358) + lVar1 * 8),
                 ypS0[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < *(int *)((long)ida_mem + 0xa0));
      return 0;
    }
    msgfmt = "IDAGetConsistentIC can only be called before IDASolve.";
    iVar2 = -0x16;
    error_code = -0x16;
    line = 0x783;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetSensConsistentIC",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int IDAGetSensConsistentIC(void* ida_mem, N_Vector* yyS0, N_Vector* ypS0)
{
  IDAMem IDA_mem;
  int is;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  if (IDA_mem->ida_kused != 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_TOO_LATE);
    return (IDA_ILL_INPUT);
  }

  if (yyS0 != NULL)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_phiS[0][is], yyS0[is]);
    }
  }

  if (ypS0 != NULL)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_phiS[1][is], ypS0[is]);
    }
  }

  return (IDA_SUCCESS);
}